

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O2

yajl_gen_status yajl_gen_double(yajl_gen g,double number)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  yajl_gen_state yVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  uint _i;
  uint uVar7;
  char *pcVar8;
  char i [32];
  
  yVar3 = g->state[g->depth];
  uVar7 = yVar3 - yajl_gen_map_start;
  if ((uVar7 < 7) && ((99U >> (uVar7 & 0x1f) & 1) != 0)) {
    return *(yajl_gen_status *)(&DAT_0010699c + (ulong)uVar7 * 4);
  }
  if (0x7fefffffffffffff < (ulong)ABS(number)) {
    return yajl_gen_invalid_number;
  }
  if (yVar3 == yajl_gen_map_val) {
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto LAB_00104fde;
    pcVar8 = " ";
  }
  else {
    if ((yVar3 != yajl_gen_in_array) || ((*g->print)(g->ctx,",",1), (g->flags & 1) == 0))
    goto LAB_00104fde;
    pcVar8 = "\n";
  }
  (*g->print)(g->ctx,pcVar8,1);
LAB_00104fde:
  if (((g->flags & 1) != 0) && (uVar4 = (ulong)g->depth, g->state[uVar4] != yajl_gen_map_val)) {
    for (uVar7 = 0; uVar7 < (uint)uVar4; uVar7 = uVar7 + 1) {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar8 = g->indentString;
      sVar5 = strlen(pcVar8);
      (*p_Var1)(pvVar2,pcVar8,sVar5 & 0xffffffff);
      uVar4 = (ulong)g->depth;
    }
  }
  sprintf(i,"%.20g",number);
  sVar5 = strspn(i,"0123456789-");
  sVar6 = strlen(i);
  if (sVar5 == sVar6) {
    sVar5 = strlen(i);
    (i + sVar5)[0] = '.';
    (i + sVar5)[1] = '0';
    i[sVar5 + 2] = '\0';
  }
  p_Var1 = g->print;
  pvVar2 = g->ctx;
  sVar5 = strlen(i);
  (*p_Var1)(pvVar2,i,sVar5 & 0xffffffff);
  yVar3 = g->state[g->depth];
  if ((ulong)yVar3 < 5) {
    yVar3 = *(yajl_gen_state *)(&DAT_001069b8 + (ulong)yVar3 * 4);
    g->state[g->depth] = yVar3;
  }
  if (((g->flags & 1) != 0) && (yVar3 == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_double(yajl_gen g, double number)
{
    char i[32];
    ENSURE_VALID_STATE; ENSURE_NOT_KEY;
    if (isnan(number) || isinf(number)) return yajl_gen_invalid_number;
    INSERT_SEP; INSERT_WHITESPACE;
    sprintf(i, "%.20g", number);
    if (strspn(i, "0123456789-") == strlen(i)) {
        strcat(i, ".0");
    }
    g->print(g->ctx, i, (unsigned int)strlen(i));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}